

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int zisofs_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  size_t __size;
  void *pvVar5;
  long lVar6;
  undefined8 *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  uint32_t bed;
  uint32_t bst;
  int err;
  size_t alloc;
  size_t xsize;
  size_t ceil;
  int r;
  size_t uncompressed_size;
  ssize_t bytes_read;
  size_t avail;
  uchar *p;
  zisofs *zisofs;
  iso9660 *iso9660;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar7;
  size_t local_70;
  int local_5c;
  long local_58;
  ulong local_50;
  ulong local_48;
  void *local_40;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  local_40 = __archive_read_ahead
                       ((archive_read *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (ssize_t *)0x140633);
  if ((long)local_50 < 1) {
    archive_set_error(in_RDI,0x54,"Truncated zisofs file body");
    return -0x1e;
  }
  if (*(long *)(lVar1 + 0xd8) < (long)local_50) {
    local_50 = *(ulong *)(lVar1 + 0xd8);
  }
  local_48 = local_50;
  local_58 = 0;
  if (*(int *)(lVar1 + 0xf8) == 0) {
    uVar4 = (((*(long *)(lVar1 + 0xf0) + (1L << ((byte)*(undefined4 *)(lVar1 + 0xec) & 0x3f))) - 1U
             >> ((byte)*(undefined4 *)(lVar1 + 0xec) & 0x3f)) + 1) * 4;
    if (*(ulong *)(lVar1 + 0x140) < uVar4) {
      if (*(long *)(lVar1 + 0x138) != 0) {
        free(*(void **)(lVar1 + 0x138));
      }
      __size = ((uVar4 >> 10) + 1) * 0x400;
      pvVar5 = malloc(__size);
      *(void **)(lVar1 + 0x138) = pvVar5;
      if (*(long *)(lVar1 + 0x138) == 0) {
        archive_set_error(in_RDI,0xc,"No memory for zisofs decompression");
        return -0x1e;
      }
      *(size_t *)(lVar1 + 0x140) = __size;
    }
    *(ulong *)(lVar1 + 0x148) = uVar4;
    uVar4 = 1L << ((byte)*(undefined4 *)(lVar1 + 0xec) & 0x3f);
    if (*(ulong *)(lVar1 + 0x108) < uVar4) {
      if (*(long *)(lVar1 + 0x100) != 0) {
        free(*(void **)(lVar1 + 0x100));
      }
      pvVar5 = malloc(uVar4);
      *(void **)(lVar1 + 0x100) = pvVar5;
      if (*(long *)(lVar1 + 0x100) == 0) {
        archive_set_error(in_RDI,0xc,"No memory for zisofs decompression");
        return -0x1e;
      }
    }
    *(ulong *)(lVar1 + 0x108) = uVar4;
    if (*(ulong *)(lVar1 + 0x128) < 0x10) {
      local_70 = 0x10 - *(long *)(lVar1 + 0x128);
      if (local_50 < local_70) {
        local_70 = local_50;
      }
      memcpy((void *)(lVar1 + 0x114 + *(long *)(lVar1 + 0x128)),local_40,local_70);
      *(size_t *)(lVar1 + 0x128) = local_70 + *(long *)(lVar1 + 0x128);
      local_48 = local_50 - local_70;
      local_40 = (void *)(local_70 + (long)local_40);
    }
    if ((*(int *)(lVar1 + 0x130) == 0) && (*(long *)(lVar1 + 0x128) == 0x10)) {
      uVar7 = (uint)(*(long *)(lVar1 + 0x114) != 0x7d6dbc99653e437);
      uVar2 = archive_le32dec((void *)(lVar1 + 0x11c));
      if ((ulong)uVar2 != *(ulong *)(lVar1 + 0xf0)) {
        uVar7 = 1;
      }
      if (*(char *)(lVar1 + 0x120) != '\x04') {
        uVar7 = 1;
      }
      if ((uint)*(byte *)(lVar1 + 0x121) != *(uint *)(lVar1 + 0xec)) {
        uVar7 = 1;
      }
      if (uVar7 != 0) {
        archive_set_error(in_RDI,0x54,"Illegal zisofs file body");
        return -0x1e;
      }
      *(undefined4 *)(lVar1 + 0x130) = 1;
    }
    if ((*(int *)(lVar1 + 0x130) != 0) && (*(ulong *)(lVar1 + 0x150) < *(ulong *)(lVar1 + 0x148))) {
      local_70 = *(long *)(lVar1 + 0x148) - *(long *)(lVar1 + 0x150);
      if (local_48 < local_70) {
        local_70 = local_48;
      }
      memcpy((void *)(*(long *)(lVar1 + 0x138) + *(long *)(lVar1 + 0x150)),local_40,local_70);
      *(size_t *)(lVar1 + 0x150) = local_70 + *(long *)(lVar1 + 0x150);
      local_48 = local_48 - local_70;
      local_40 = (void *)(local_70 + (long)local_40);
      if (*(long *)(lVar1 + 0x150) == *(long *)(lVar1 + 0x148)) {
        *(undefined8 *)(lVar1 + 0x158) = 0;
        *(undefined4 *)(lVar1 + 0x160) = 0;
        *(undefined4 *)(lVar1 + 0xf8) = 1;
      }
    }
    if (*(int *)(lVar1 + 0xf8) == 0) goto LAB_00140db0;
  }
  if (*(int *)(lVar1 + 0x160) == 0) {
    if (*(ulong *)(lVar1 + 0x148) <= *(long *)(lVar1 + 0x158) + 4U) {
      archive_set_error(in_RDI,0x54,"Illegal zisofs block pointers");
      return -0x1e;
    }
    uVar2 = archive_le32dec((void *)(*(long *)(lVar1 + 0x138) + *(long *)(lVar1 + 0x158)));
    if ((ulong)uVar2 != (ulong)*(uint *)(lVar1 + 0x110) + (local_50 - local_48)) {
      archive_set_error(in_RDI,0x54,"Illegal zisofs block pointers(cannot seek)");
      return -0x1e;
    }
    uVar3 = archive_le32dec((void *)(*(long *)(lVar1 + 0x138) + *(long *)(lVar1 + 0x158) + 4));
    if (uVar3 < uVar2) {
      archive_set_error(in_RDI,0x54,"Illegal zisofs block pointers");
      return -0x1e;
    }
    *(uint32_t *)(lVar1 + 0x160) = uVar3 - uVar2;
    *(long *)(lVar1 + 0x158) = *(long *)(lVar1 + 0x158) + 4;
    if (*(int *)(lVar1 + 0x1d8) == 0) {
      local_5c = inflateInit_(lVar1 + 0x168,"1.2.11",0x70);
    }
    else {
      local_5c = inflateReset(lVar1 + 0x168);
    }
    if (local_5c != 0) {
      archive_set_error(in_RDI,-1,"Can\'t initialize zisofs decompression.");
      return -0x1e;
    }
    *(undefined4 *)(lVar1 + 0x1d8) = 1;
    *(undefined8 *)(lVar1 + 0x178) = 0;
    *(undefined8 *)(lVar1 + 400) = 0;
  }
  if (*(int *)(lVar1 + 0x160) == 0) {
    memset(*(void **)(lVar1 + 0x100),0,*(size_t *)(lVar1 + 0x108));
    local_58 = *(long *)(lVar1 + 0x108);
  }
  else {
    *(void **)(lVar1 + 0x168) = local_40;
    if (*(uint *)(lVar1 + 0x160) < local_48) {
      *(undefined4 *)(lVar1 + 0x170) = *(undefined4 *)(lVar1 + 0x160);
    }
    else {
      *(int *)(lVar1 + 0x170) = (int)local_48;
    }
    *(undefined8 *)(lVar1 + 0x180) = *(undefined8 *)(lVar1 + 0x100);
    *(undefined4 *)(lVar1 + 0x188) = *(undefined4 *)(lVar1 + 0x108);
    uVar7 = inflate(lVar1 + 0x168,0);
    if (1 < uVar7) {
      archive_set_error(in_RDI,-1,"zisofs decompression failed (%d)",(ulong)uVar7);
      return -0x1e;
    }
    local_58 = *(long *)(lVar1 + 0x108) - (ulong)*(uint *)(lVar1 + 0x188);
    local_48 = local_48 - (*(long *)(lVar1 + 0x168) - (long)local_40);
    *(int *)(lVar1 + 0x160) =
         *(int *)(lVar1 + 0x160) - ((int)*(undefined8 *)(lVar1 + 0x168) - (int)local_40);
  }
LAB_00140db0:
  lVar6 = local_50 - local_48;
  *in_RSI = *(undefined8 *)(lVar1 + 0x100);
  *in_RDX = local_58;
  *in_RCX = *(undefined8 *)(lVar1 + 0xd0);
  *(long *)(lVar1 + 0xd0) = local_58 + *(long *)(lVar1 + 0xd0);
  *(long *)(lVar1 + 0xd8) = *(long *)(lVar1 + 0xd8) - lVar6;
  *(long *)(lVar1 + 0xa0) = lVar6 + *(long *)(lVar1 + 0xa0);
  *(int *)(lVar1 + 0x110) = (int)lVar6 + *(int *)(lVar1 + 0x110);
  *(long *)(lVar1 + 0xe0) = lVar6 + *(long *)(lVar1 + 0xe0);
  return 0;
}

Assistant:

static int
zisofs_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct iso9660 *iso9660;
	struct zisofs  *zisofs;
	const unsigned char *p;
	size_t avail;
	ssize_t bytes_read;
	size_t uncompressed_size;
	int r;

	iso9660 = (struct iso9660 *)(a->format->data);
	zisofs = &iso9660->entry_zisofs;

	p = __archive_read_ahead(a, 1, &bytes_read);
	if (bytes_read <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated zisofs file body");
		return (ARCHIVE_FATAL);
	}
	if (bytes_read > iso9660->entry_bytes_remaining)
		bytes_read = (ssize_t)iso9660->entry_bytes_remaining;
	avail = bytes_read;
	uncompressed_size = 0;

	if (!zisofs->initialized) {
		size_t ceil, xsize;

		/* Allocate block pointers buffer. */
		ceil = (size_t)((zisofs->pz_uncompressed_size +
			(((int64_t)1) << zisofs->pz_log2_bs) - 1)
			>> zisofs->pz_log2_bs);
		xsize = (ceil + 1) * 4;
		if (zisofs->block_pointers_alloc < xsize) {
			size_t alloc;

			if (zisofs->block_pointers != NULL)
				free(zisofs->block_pointers);
			alloc = ((xsize >> 10) + 1) << 10;
			zisofs->block_pointers = malloc(alloc);
			if (zisofs->block_pointers == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for zisofs decompression");
				return (ARCHIVE_FATAL);
			}
			zisofs->block_pointers_alloc = alloc;
		}
		zisofs->block_pointers_size = xsize;

		/* Allocate uncompressed data buffer. */
		xsize = (size_t)1UL << zisofs->pz_log2_bs;
		if (zisofs->uncompressed_buffer_size < xsize) {
			if (zisofs->uncompressed_buffer != NULL)
				free(zisofs->uncompressed_buffer);
			zisofs->uncompressed_buffer = malloc(xsize);
			if (zisofs->uncompressed_buffer == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for zisofs decompression");
				return (ARCHIVE_FATAL);
			}
		}
		zisofs->uncompressed_buffer_size = xsize;

		/*
		 * Read the file header, and check the magic code of zisofs.
		 */
		if (zisofs->header_avail < sizeof(zisofs->header)) {
			xsize = sizeof(zisofs->header) - zisofs->header_avail;
			if (avail < xsize)
				xsize = avail;
			memcpy(zisofs->header + zisofs->header_avail, p, xsize);
			zisofs->header_avail += xsize;
			avail -= xsize;
			p += xsize;
		}
		if (!zisofs->header_passed &&
		    zisofs->header_avail == sizeof(zisofs->header)) {
			int err = 0;

			if (memcmp(zisofs->header, zisofs_magic,
			    sizeof(zisofs_magic)) != 0)
				err = 1;
			if (archive_le32dec(zisofs->header + 8)
			    != zisofs->pz_uncompressed_size)
				err = 1;
			if (zisofs->header[12] != 4)
				err = 1;
			if (zisofs->header[13] != zisofs->pz_log2_bs)
				err = 1;
			if (err) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Illegal zisofs file body");
				return (ARCHIVE_FATAL);
			}
			zisofs->header_passed = 1;
		}
		/*
		 * Read block pointers.
		 */
		if (zisofs->header_passed &&
		    zisofs->block_pointers_avail < zisofs->block_pointers_size) {
			xsize = zisofs->block_pointers_size
			    - zisofs->block_pointers_avail;
			if (avail < xsize)
				xsize = avail;
			memcpy(zisofs->block_pointers
			    + zisofs->block_pointers_avail, p, xsize);
			zisofs->block_pointers_avail += xsize;
			avail -= xsize;
			p += xsize;
		    	if (zisofs->block_pointers_avail
			    == zisofs->block_pointers_size) {
				/* We've got all block pointers and initialize
				 * related variables.	*/
				zisofs->block_off = 0;
				zisofs->block_avail = 0;
				/* Complete a initialization */
				zisofs->initialized = 1;
			}
		}

		if (!zisofs->initialized)
			goto next_data; /* We need more data. */
	}

	/*
	 * Get block offsets from block pointers.
	 */
	if (zisofs->block_avail == 0) {
		uint32_t bst, bed;

		if (zisofs->block_off + 4 >= zisofs->block_pointers_size) {
			/* There isn't a pair of offsets. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers");
			return (ARCHIVE_FATAL);
		}
		bst = archive_le32dec(
		    zisofs->block_pointers + zisofs->block_off);
		if (bst != zisofs->pz_offset + (bytes_read - avail)) {
			/* TODO: Should we seek offset of current file
			 * by bst ? */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers(cannot seek)");
			return (ARCHIVE_FATAL);
		}
		bed = archive_le32dec(
		    zisofs->block_pointers + zisofs->block_off + 4);
		if (bed < bst) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers");
			return (ARCHIVE_FATAL);
		}
		zisofs->block_avail = bed - bst;
		zisofs->block_off += 4;

		/* Initialize compression library for new block. */
		if (zisofs->stream_valid)
			r = inflateReset(&zisofs->stream);
		else
			r = inflateInit(&zisofs->stream);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't initialize zisofs decompression.");
			return (ARCHIVE_FATAL);
		}
		zisofs->stream_valid = 1;
		zisofs->stream.total_in = 0;
		zisofs->stream.total_out = 0;
	}

	/*
	 * Make uncompressed data.
	 */
	if (zisofs->block_avail == 0) {
		memset(zisofs->uncompressed_buffer, 0,
		    zisofs->uncompressed_buffer_size);
		uncompressed_size = zisofs->uncompressed_buffer_size;
	} else {
		zisofs->stream.next_in = (Bytef *)(uintptr_t)(const void *)p;
		if (avail > zisofs->block_avail)
			zisofs->stream.avail_in = zisofs->block_avail;
		else
			zisofs->stream.avail_in = (uInt)avail;
		zisofs->stream.next_out = zisofs->uncompressed_buffer;
		zisofs->stream.avail_out =
		    (uInt)zisofs->uncompressed_buffer_size;

		r = inflate(&zisofs->stream, 0);
		switch (r) {
		case Z_OK: /* Decompressor made some progress.*/
		case Z_STREAM_END: /* Found end of stream. */
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "zisofs decompression failed (%d)", r);
			return (ARCHIVE_FATAL);
		}
		uncompressed_size =
		    zisofs->uncompressed_buffer_size - zisofs->stream.avail_out;
		avail -= zisofs->stream.next_in - p;
		zisofs->block_avail -= (uint32_t)(zisofs->stream.next_in - p);
	}
next_data:
	bytes_read -= avail;
	*buff = zisofs->uncompressed_buffer;
	*size = uncompressed_size;
	*offset = iso9660->entry_sparse_offset;
	iso9660->entry_sparse_offset += uncompressed_size;
	iso9660->entry_bytes_remaining -= bytes_read;
	iso9660->current_position += bytes_read;
	zisofs->pz_offset += (uint32_t)bytes_read;
	iso9660->entry_bytes_unconsumed += bytes_read;

	return (ARCHIVE_OK);
}